

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O3

UnlocalizedNumberFormatter *
icu_63::number::impl::NumberPropertyMapper::create
          (UnlocalizedNumberFormatter *__return_storage_ptr__,DecimalFormatProperties *properties,
          DecimalFormatSymbols *symbols,DecimalFormatWarehouse *warehouse,UErrorCode *status)

{
  MacroProps MStack_3b8;
  NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter> local_1f8;
  
  NumberFormatter::with();
  oldToNew(&MStack_3b8,properties,symbols,warehouse,(DecimalFormatProperties *)0x0,status);
  NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::macros
            (__return_storage_ptr__,&local_1f8,&MStack_3b8);
  Locale::~Locale(&MStack_3b8.locale);
  Scale::~Scale(&MStack_3b8.scale);
  SymbolsWrapper::~SymbolsWrapper(&MStack_3b8.symbols);
  MeasureUnit::~MeasureUnit(&MStack_3b8.perUnit);
  MeasureUnit::~MeasureUnit(&MStack_3b8.unit);
  Locale::~Locale(&local_1f8.fMacros.locale);
  Scale::~Scale(&local_1f8.fMacros.scale);
  SymbolsWrapper::~SymbolsWrapper(&local_1f8.fMacros.symbols);
  MeasureUnit::~MeasureUnit(&local_1f8.fMacros.perUnit);
  MeasureUnit::~MeasureUnit(&local_1f8.fMacros.unit);
  return __return_storage_ptr__;
}

Assistant:

UnlocalizedNumberFormatter NumberPropertyMapper::create(const DecimalFormatProperties& properties,
                                                        const DecimalFormatSymbols& symbols,
                                                        DecimalFormatWarehouse& warehouse,
                                                        UErrorCode& status) {
    return NumberFormatter::with().macros(oldToNew(properties, symbols, warehouse, nullptr, status));
}